

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O0

void test_open_address_hashmap_delete_1(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_err_t iVar2;
  void *value_00;
  ion_value_t value;
  char local_5e [8];
  char str [10];
  ion_status_t status;
  int i;
  ion_hashmap_t map;
  planck_unit_test_t *tc_local;
  
  status.error = '\x02';
  status._1_3_ = 0;
  initialize_hash_map_std_conditions((ion_hashmap_t *)&status.count);
  sprintf(local_5e,"%02i is key",(ulong)(uint)status._0_4_);
  str._2_8_ = oah_insert((ion_hashmap_t *)&status.count,&status,local_5e);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(str[2] == '\0'),0x315,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(str._6_4_ == 1),0x316,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  str._2_8_ = oah_delete((ion_hashmap_t *)&status.count,&status);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(str[2] == '\0'),0x319,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(str._6_4_ == 1),0x31a,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  value_00 = malloc(10);
  str._2_8_ = oah_get((ion_hashmap_t *)&status.count,&status,value_00);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(str[2] == '\x01'),0x321,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(str._6_4_ == 0),0x322,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  if (value_00 != (void *)0x0) {
    free(value_00);
  }
  str._2_8_ = oah_delete((ion_hashmap_t *)&status.count,&status);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(str[2] == '\x01'),0x32a,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(str._6_4_ == 0),0x32b,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  iVar2 = oah_destroy((ion_hashmap_t *)&status.count);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar2 == '\0'),0x32d,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  return;
}

Assistant:

void
test_open_address_hashmap_delete_1(
	planck_unit_test_t *tc
) {
	ion_hashmap_t	map;							/* create handler for hashmap */
	int				i = 2;
	ion_status_t	status;

	initialize_hash_map_std_conditions(&map);

	char str[10];

	sprintf(str, "%02i is key", i);
	status = oah_insert(&map, (&i), str);
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

	status = oah_delete(&map, (&i));
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

	/* Check that value is not there */
	ion_value_t value;

	value	= malloc(10);
	status	= oah_get(&map, (&i), value);
	PLANCK_UNIT_ASSERT_TRUE(tc, err_item_not_found == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 0 == status.count);

	if (value != NULL) {
		free(value);
	}

	/* Check that value can not be deleted if it is not there already */
	status = oah_delete(&map, (&i));
	PLANCK_UNIT_ASSERT_TRUE(tc, err_item_not_found == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 0 == status.count);

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}